

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlookup.cpp
# Opt level: O1

bool __thiscall Vlookup::VertexLess::operator()(VertexLess *this,int v1,int v2)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  
  pfVar2 = (float *)&mFind;
  pfVar3 = (float *)&mFind;
  if (v1 != -1) {
    pfVar3 = (float *)((long)v1 * 0xc + *mList);
  }
  if (v2 != -1) {
    pfVar2 = (float *)((long)v2 * 0xc + *mList);
  }
  bVar1 = true;
  if ((int)(*pfVar2 * 10000.0) <= (int)(*pfVar3 * 10000.0)) {
    if ((int)(*pfVar3 * 10000.0) <= (int)(*pfVar2 * 10000.0)) {
      if ((int)(pfVar3[1] * 10000.0) < (int)(pfVar2[1] * 10000.0)) {
        return true;
      }
      if ((int)(pfVar3[1] * 10000.0) <= (int)(pfVar2[1] * 10000.0)) {
        return (int)(pfVar3[2] * 10000.0) < (int)(pfVar2[2] * 10000.0);
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VertexLess::operator()(int v1,int v2) const
{

	const VertexPosition& a = Get(v1);
	const VertexPosition& b = Get(v2);

  int ixA = (int) (a.GetX()*10000.0f);
  int ixB = (int) (b.GetX()*10000.0f);

	if ( ixA      < ixB      ) return true;
	if ( ixA      > ixB      ) return false;

  int iyA = (int) (a.GetY()*10000.0f);
  int iyB = (int) (b.GetY()*10000.0f);

	if ( iyA      < iyB      ) return true;
	if ( iyA      > iyB      ) return false;

  int izA = (int) (a.GetZ()*10000.0f);
  int izB = (int) (b.GetZ()*10000.0f);

	if ( izA      < izB      ) return true;
	if ( izA      > izB      ) return false;


	return false;
}